

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretFlow.c
# Opt level: O1

int dfsplain_r(Abc_Obj_t *pObj,Abc_Obj_t *pPred)

{
  Flow_Data_t *pFVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  
  uVar4 = *(uint *)&pObj->field_0x14 & 0xf;
  if ((uVar4 == 8) ||
     ((pManMR->fIsForward != 0 &&
      ((uVar4 == 3 ||
       ((pManMR->fIsForward != 0 &&
        ((*(uint *)(pManMR->pDataArray + (uint)pObj->Id) & pManMR->constraintMask & 0x90) != 0))))))
     )) {
    if (pPred == (Abc_Obj_t *)0x0) {
      __assert_fail("pPred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretFlow.c"
                    ,0x271,"int dfsplain_r(Abc_Obj_t *, Abc_Obj_t *)");
    }
    return 1;
  }
  *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
       *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) | 2;
  pFVar1 = pManMR->pDataArray;
  if ((undefined1  [24])((undefined1  [24])pFVar1[(uint)pObj->Id] & (undefined1  [24])0x4) ==
      (undefined1  [24])0x0) {
    if (((undefined1  [24])((undefined1  [24])pFVar1[(uint)pObj->Id] & (undefined1  [24])0x1) ==
         (undefined1  [24])0x0) && (iVar3 = dfsplain_e(pObj,pObj), iVar3 != 0)) {
      *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
           *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) | 4;
      if ((*(uint *)&pObj->field_0x14 & 0xf) != 8) {
        pManMR->pDataArray[(uint)pObj->Id].field_1.pred = pPred;
        return 1;
      }
      __assert_fail("!Abc_ObjIsLatch(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretime.h"
                    ,0x8d,"void FSETPRED(Abc_Obj_t *, Abc_Obj_t *)");
    }
  }
  else {
    pAVar2 = pFVar1[(uint)pObj->Id].field_1.pred;
    if (((pAVar2 != (Abc_Obj_t *)0x0) &&
        ((undefined1  [24])((undefined1  [24])pFVar1[(uint)pAVar2->Id] & (undefined1  [24])0x1) ==
         (undefined1  [24])0x0)) && (iVar3 = dfsplain_e(pAVar2,pAVar2), iVar3 != 0)) {
      FSETPRED(pObj,pPred);
      return 1;
    }
  }
  if (pManMR->fIsForward == 0) {
    return 0;
  }
  if (0 < (pObj->vFanins).nSize) {
    lVar6 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar6]];
      if ((((undefined1  [24])
            ((undefined1  [24])pManMR->pDataArray[(uint)pAVar2->Id] & (undefined1  [24])0x2) ==
            (undefined1  [24])0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) != 8)) &&
         (iVar3 = dfsplain_r(pAVar2,pPred), iVar3 != 0)) {
        return 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (pObj->vFanins).nSize);
  }
  if (pManMR->maxDelay == 0) {
    return 0;
  }
  if (0 < pManMR->vTimeEdges[(uint)pObj->Id].nSize) {
    pVVar5 = pManMR->vTimeEdges + (uint)pObj->Id;
    lVar6 = 0;
    while (((undefined1  [24])
            ((undefined1  [24])pManMR->pDataArray[(uint)((Abc_Obj_t *)pVVar5->pArray[lVar6])->Id] &
            (undefined1  [24])0x2) != (undefined1  [24])0x0 ||
           (iVar3 = dfsplain_r((Abc_Obj_t *)pVVar5->pArray[lVar6],pPred), iVar3 == 0))) {
      lVar6 = lVar6 + 1;
      pVVar5 = pManMR->vTimeEdges + (uint)pObj->Id;
      if (pManMR->vTimeEdges[(uint)pObj->Id].nSize <= lVar6) {
        return 0;
      }
    }
    return 1;
  }
  return 0;
}

Assistant:

int dfsplain_r( Abc_Obj_t *pObj, Abc_Obj_t *pPred ) {
  int i;
  Abc_Obj_t *pNext, *pOldPred;

  // have we reached the sink?
  if (Abc_ObjIsLatch(pObj) || 
      (pManMR->fIsForward && Abc_ObjIsPo(pObj)) || 
      (pManMR->fIsForward && FTEST(pObj, BLOCK_OR_CONS) & pManMR->constraintMask)) {
    assert(pPred);
    return 1;
  }

  FSET(pObj, VISITED_R);

  // printf(" %dr\n", Abc_ObjId(pObj));

  if (FTEST(pObj, FLOW)) {

    pOldPred = FGETPRED(pObj);
    if (pOldPred && 
        !FTEST(pOldPred, VISITED_E) &&
        dfsplain_e(pOldPred, pOldPred)) {

      FSETPRED(pObj, pPred);

#ifdef DEBUG_PRINT_FLOWS
      printf("fr");
#endif
      goto found;
    }
    
  } else {

    if (!FTEST(pObj, VISITED_E) &&
        dfsplain_e(pObj, pObj)) {

      FSET(pObj, FLOW);
      FSETPRED(pObj, pPred);

#ifdef DEBUG_PRINT_FLOWS
      printf("f");
#endif
      goto found;
    }
  }
 
  // 2. follow reverse edges
  if (pManMR->fIsForward) { // forward retiming only
    Abc_ObjForEachFanin( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_R) &&
          !Abc_ObjIsLatch(pNext) &&
          dfsplain_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("i");
#endif
        goto found;
      }
    }
  
  // 3. timing edges (forward only)
#if !defined(IGNORE_TIMING)
    if (pManMR->maxDelay) 
      Vec_PtrForEachEntry(Abc_Obj_t*, FTIMEEDGES(pObj), pNext, i) {
        if (!FTEST(pNext, VISITED_R) &&
            dfsplain_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
          printf("o");
#endif
          goto found;
        }
      }
#endif
  }
  
  return 0;

 found:
#ifdef DEBUG_PRINT_FLOWS
  printf("%d ", Abc_ObjId(pObj));
#endif
  return 1;
}